

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O1

int __thiscall
jrtplib::RTCPCompoundPacketBuilder::AddReportBlock
          (RTCPCompoundPacketBuilder *this,uint32_t ssrc,uint8_t fractionlost,int32_t packetslost,
          uint32_t exthighestseq,uint32_t jitter,uint32_t lsr,uint32_t dlsr)

{
  size_t *psVar1;
  size_t sVar2;
  size_t sVar3;
  RTPMemoryManager *pRVar4;
  int iVar5;
  size_t sVar6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  
  iVar5 = -0x2a;
  if (this->arebuilding == true) {
    if ((this->report).headerlength == 0) {
      iVar5 = -0x2c;
    }
    else {
      sVar2 = this->appsize;
      sVar3 = this->byesize;
      sVar6 = SDES::NeededBytes(&this->sdes);
      uVar10 = (this->report).reportblocks.
               super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
               ._M_impl._M_node._M_size + 1;
      lVar11 = (ulong)(0x842108421084210 < uVar10 * -0x1084210842108421) + uVar10 / 0x1f;
      lVar9 = uVar10 * 0x18 + lVar11 * 8 + 0x14;
      if ((this->report).isSR == false) {
        lVar9 = uVar10 * 0x18 + lVar11 * 8;
      }
      iVar5 = -0x2b;
      if (lVar9 + sVar6 + sVar2 + sVar3 <= this->maximumpacketsize) {
        pRVar4 = (this->super_RTCPCompoundPacket).super_RTPMemoryObject.mgr;
        if (pRVar4 == (RTPMemoryManager *)0x0) {
          p_Var7 = (_List_node_base *)operator_new__(0x18);
        }
        else {
          p_Var7 = (_List_node_base *)(**(code **)(*(long *)pRVar4 + 0x10))(pRVar4,0x18,0x12);
        }
        if (p_Var7 == (_List_node_base *)0x0) {
          iVar5 = -1;
        }
        else {
          *(uint32_t *)&p_Var7->_M_next =
               ssrc >> 0x18 | (ssrc & 0xff0000) >> 8 | (ssrc & 0xff00) << 8 | ssrc << 0x18;
          *(uint8_t *)((long)&p_Var7->_M_next + 4) = fractionlost;
          *(char *)((long)&p_Var7->_M_next + 7) = (char)packetslost;
          *(char *)((long)&p_Var7->_M_next + 6) = (char)((uint)packetslost >> 8);
          *(char *)((long)&p_Var7->_M_next + 5) = (char)((uint)packetslost >> 0x10);
          *(uint32_t *)&p_Var7->_M_prev =
               exthighestseq >> 0x18 | (exthighestseq & 0xff0000) >> 8 |
               (exthighestseq & 0xff00) << 8 | exthighestseq << 0x18;
          *(uint32_t *)((long)&p_Var7->_M_prev + 4) =
               jitter >> 0x18 | (jitter & 0xff0000) >> 8 | (jitter & 0xff00) << 8 | jitter << 0x18;
          *(uint32_t *)&p_Var7[1]._M_next =
               lsr >> 0x18 | (lsr & 0xff0000) >> 8 | (lsr & 0xff00) << 8 | lsr << 0x18;
          *(uint32_t *)((long)&p_Var7[1]._M_next + 4) =
               dlsr >> 0x18 | (dlsr & 0xff0000) >> 8 | (dlsr & 0xff00) << 8 | dlsr << 0x18;
          p_Var8 = (_List_node_base *)operator_new(0x20);
          p_Var8[1]._M_next = p_Var7;
          p_Var8[1]._M_prev = (_List_node_base *)0x18;
          std::__detail::_List_node_base::_M_hook(p_Var8);
          psVar1 = &(this->report).reportblocks.
                    super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
                    ._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          iVar5 = 0;
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int RTCPCompoundPacketBuilder::AddReportBlock(uint32_t ssrc,uint8_t fractionlost,int32_t packetslost,uint32_t exthighestseq,
	                                      uint32_t jitter,uint32_t lsr,uint32_t dlsr)
{
	if (!arebuilding)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTBUILDING;
	if (report.headerlength == 0)
		return ERR_RTP_RTCPCOMPPACKBUILDER_REPORTNOTSTARTED;

#ifndef RTP_SUPPORT_RTCPUNKNOWN
	size_t totalothersize = byesize+appsize+sdes.NeededBytes();
#else
	size_t totalothersize = byesize+appsize+unknownsize+sdes.NeededBytes();
#endif // RTP_SUPPORT_RTCPUNKNOWN 
	size_t reportsizewithextrablock = report.NeededBytesWithExtraReportBlock();
	
	if ((totalothersize+reportsizewithextrablock) > maximumpacketsize)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT;

	uint8_t *buf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTCPRECEIVERREPORT) uint8_t[sizeof(RTCPReceiverReport)];
	if (buf == 0)
		return ERR_RTP_OUTOFMEM;
	
	RTCPReceiverReport *rr = (RTCPReceiverReport *)buf;
	uint32_t *packlost = (uint32_t *)&packetslost;
	uint32_t packlost2 = (*packlost);
		
	rr->ssrc = htonl(ssrc);
	rr->fractionlost = fractionlost;
	rr->packetslost[2] = (uint8_t)(packlost2&0xFF);
	rr->packetslost[1] = (uint8_t)((packlost2>>8)&0xFF);
	rr->packetslost[0] = (uint8_t)((packlost2>>16)&0xFF);
	rr->exthighseqnr = htonl(exthighestseq);
	rr->jitter = htonl(jitter);
	rr->lsr = htonl(lsr);
	rr->dlsr = htonl(dlsr);

	report.reportblocks.push_back(Buffer(buf,sizeof(RTCPReceiverReport)));
	return 0;
}